

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

void __thiscall Js::ConfigFlagsTable::VerboseDump(ConfigFlagsTable *this)

{
  if (this->flagPresent[0] == true) {
    Output::Print(L"-%s",L"ArrayValidate");
    if (this->ArrayValidate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[1] == true) {
    Output::Print(L"-%s",L"MemOpMissingValueValidate");
    if (this->MemOpMissingValueValidate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[2] == true) {
    Output::Print(L"-%s",L"OOPJITFixupValidate");
    if (this->OOPJITFixupValidate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[3] == true) {
    Output::Print(L"-%s",L"ArenaNoFreeList");
    if (this->ArenaNoFreeList == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[4] == true) {
    Output::Print(L"-%s",L"ArenaNoPageReuse");
    if (this->ArenaNoPageReuse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[5] == true) {
    Output::Print(L"-%s",L"ArenaUseHeapAlloc");
    if (this->ArenaUseHeapAlloc == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[6] == true) {
    Output::Print(L"-%s",L"ValidateInlineStack");
    if (this->ValidateInlineStack == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[7] == true) {
    Output::Print(L"-%s",L"AsmDiff");
    if (this->AsmDiff == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[8] == true) {
    Output::Print(L"-%s",L"AsmDumpMode");
    Output::Print(L":%s",(this->AsmDumpMode).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[9] == true) {
    Output::Print(L"-%s",L"AsmJs");
    if (this->AsmJs == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[10] == true) {
    Output::Print(L"-%s",L"AsmJsStopOnError");
    if (this->AsmJsStopOnError == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb] == true) {
    Output::Print(L"-%s",L"AsmJsEdge");
    if (this->AsmJsEdge == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc] == true) {
    Output::Print(L"-%s",L"Wasm");
    if (this->Wasm == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd] == true) {
    Output::Print(L"-%s",L"WasmI64");
    if (this->WasmI64 == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe] == true) {
    Output::Print(L"-%s",L"WasmFastArray");
    if (this->WasmFastArray == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf] == true) {
    Output::Print(L"-%s",L"WasmSharedArrayVirtualBuffer");
    if (this->WasmSharedArrayVirtualBuffer == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10] == true) {
    Output::Print(L"-%s",L"WasmMathExFilter");
    if (this->WasmMathExFilter == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11] == true) {
    Output::Print(L"-%s",L"WasmCheckVersion");
    if (this->WasmCheckVersion == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x12] == true) {
    Output::Print(L"-%s",L"WasmAssignModuleID");
    if (this->WasmAssignModuleID == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13] == true) {
    Output::Print(L"-%s",L"WasmIgnoreLimits");
    if (this->WasmIgnoreLimits == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14] == true) {
    Output::Print(L"-%s",L"WasmFold");
    if (this->WasmFold == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15] == true) {
    Output::Print(L"-%s",L"WasmIgnoreResponse");
    if (this->WasmIgnoreResponse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16] == true) {
    Output::Print(L"-%s",L"WasmMaxTableSize");
    Output::Print(L":%d",(ulong)(uint)this->WasmMaxTableSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17] == true) {
    Output::Print(L"-%s",L"WasmThreads");
    if (this->WasmThreads == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18] == true) {
    Output::Print(L"-%s",L"WasmMultiValue");
    if (this->WasmMultiValue == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19] == true) {
    Output::Print(L"-%s",L"WasmSignExtends");
    if (this->WasmSignExtends == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a] == true) {
    Output::Print(L"-%s",L"WasmNontrapping");
    if (this->WasmNontrapping == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b] == true) {
    Output::Print(L"-%s",L"WasmExperimental");
    if (this->WasmExperimental == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c] == true) {
    Output::Print(L"-%s",L"WasmSimd");
    if (this->WasmSimd == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d] == true) {
    Output::Print(L"-%s",L"AssertBreak");
    if (this->AssertBreak == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1e] == true) {
    Output::Print(L"-%s",L"AssertPopUp");
    if (this->AssertPopUp == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1f] == true) {
    Output::Print(L"-%s",L"AssertIgnore");
    if (this->AssertIgnore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x20] == true) {
    Output::Print(L"-%s",L"AsyncDebugging");
    if (this->AsyncDebugging == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x21] == true) {
    Output::Print(L"-%s",L"BailOnNoProfileLimit");
    Output::Print(L":%d",(ulong)(uint)this->BailOnNoProfileLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x22] == true) {
    Output::Print(L"-%s",L"BailOnNoProfileRejitLimit");
    Output::Print(L":%d",(ulong)(uint)this->BailOnNoProfileRejitLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x23] == true) {
    Output::Print(L"-%s",L"BaselineMode");
    if (this->BaselineMode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x24] == true) {
    Output::Print(L"-%s",L"DumpOnCrash");
    Output::Print(L":%s",(this->DumpOnCrash).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x25] == true) {
    Output::Print(L"-%s",L"FullMemoryDump");
    Output::Print(L":%s",(this->FullMemoryDump).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x26] == true) {
    Output::Print(L"-%s",L"BailOut");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x27] == true) {
    Output::Print(L"-%s",L"BailOutAtEveryLine");
    if (this->BailOutAtEveryLine == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x28] == true) {
    Output::Print(L"-%s",L"BailOutAtEveryByteCode");
    if (this->BailOutAtEveryByteCode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x29] == true) {
    Output::Print(L"-%s",L"BailOutAtEveryImplicitCall");
    if (this->BailOutAtEveryImplicitCall == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2a] == true) {
    Output::Print(L"-%s",L"BailOutByteCode");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2b] == true) {
    Output::Print(L"-%s",L"Benchmark");
    if (this->Benchmark == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2c] == true) {
    Output::Print(L"-%s",L"BgJit");
    if (this->BgJit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2d] == true) {
    Output::Print(L"-%s",L"BgParse");
    if (this->BgParse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2e] == true) {
    Output::Print(L"-%s",L"BgJitDelay");
    Output::Print(L":%d",(ulong)(uint)this->BgJitDelay);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x2f] == true) {
    Output::Print(L"-%s",L"BgJitDelayFgBuffer");
    Output::Print(L":%d",(ulong)(uint)this->BgJitDelayFgBuffer);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x30] == true) {
    Output::Print(L"-%s",L"BgJitPendingFuncCap");
    Output::Print(L":%d",(ulong)(uint)this->BgJitPendingFuncCap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x31] == true) {
    Output::Print(L"-%s",L"CreateFunctionProxy");
    if (this->CreateFunctionProxy == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x32] == true) {
    Output::Print(L"-%s",L"HybridFgJit");
    if (this->HybridFgJit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x33] == true) {
    Output::Print(L"-%s",L"HybridFgJitBgQueueLengthThreshold");
    Output::Print(L":%d",(ulong)(uint)this->HybridFgJitBgQueueLengthThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x34] == true) {
    Output::Print(L"-%s",L"BytecodeHist");
    if (this->BytecodeHist == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x35] == true) {
    Output::Print(L"-%s",L"CurrentSourceInfo");
    if (this->CurrentSourceInfo == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x36] == true) {
    Output::Print(L"-%s",L"CFGLog");
    if (this->CFGLog == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x37] == true) {
    Output::Print(L"-%s",L"CheckAlignment");
    if (this->CheckAlignment == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x38] == true) {
    Output::Print(L"-%s",L"CheckEmitBufferPermissions");
    if (this->CheckEmitBufferPermissions == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x39] == true) {
    Output::Print(L"-%s",L"CheckMemoryLeak");
    if (this->CheckMemoryLeak == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3a] == true) {
    Output::Print(L"-%s",L"DumpOnLeak");
    Output::Print(L":%s",(this->DumpOnLeak).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3b] == true) {
    Output::Print(L"-%s",L"CheckOpHelpers");
    if (this->CheckOpHelpers == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3c] == true) {
    Output::Print(L"-%s",L"CloneInlinedPolymorphicCaches");
    if (this->CloneInlinedPolymorphicCaches == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3d] == true) {
    Output::Print(L"-%s",L"ConcurrentRuntime");
    if (this->ConcurrentRuntime == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3e] == true) {
    Output::Print(L"-%s",L"ConstructorInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->ConstructorInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x3f] == true) {
    Output::Print(L"-%s",L"ConstructorCallsRequiredToFinalizeCachedType");
    Output::Print(L":%d",(ulong)(uint)this->ConstructorCallsRequiredToFinalizeCachedType);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x40] == true) {
    Output::Print(L"-%s",L"PropertyCacheMissPenalty");
    Output::Print(L":%d",(ulong)(uint)this->PropertyCacheMissPenalty);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x41] == true) {
    Output::Print(L"-%s",L"PropertyCacheMissThreshold");
    Output::Print(L":%d",(ulong)(uint)this->PropertyCacheMissThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x42] == true) {
    Output::Print(L"-%s",L"PropertyCacheMissReset");
    Output::Print(L":%d",(ulong)(uint)this->PropertyCacheMissReset);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x43] == true) {
    Output::Print(L"-%s",L"CrashOnException");
    if (this->CrashOnException == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x44] == true) {
    Output::Print(L"-%s",L"Debug");
    if (this->Debug == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x45] == true) {
    Output::Print(L"-%s",L"DebugBreak");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x46] == true) {
    Output::Print(L"-%s",L"StatementDebugBreak");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x47] == true) {
    Output::Print(L"-%s",L"DebugBreakOnPhaseBegin");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x48] == true) {
    Output::Print(L"-%s",L"DebugWindow");
    if (this->DebugWindow == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x49] == true) {
    Output::Print(L"-%s",L"ParserStateCache");
    if (this->ParserStateCache == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4a] == true) {
    Output::Print(L"-%s",L"CompressParserStateCache");
    if (this->CompressParserStateCache == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4b] == true) {
    Output::Print(L"-%s",L"DeferTopLevelTillFirstCall");
    if (this->DeferTopLevelTillFirstCall == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4c] == true) {
    Output::Print(L"-%s",L"DeferParse");
    Output::Print(L":%d",(ulong)(uint)this->DeferParse);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4d] == true) {
    Output::Print(L"-%s",L"DirectCallTelemetryStats");
    if (this->DirectCallTelemetryStats == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4e] == true) {
    Output::Print(L"-%s",L"DisableArrayBTree");
    if (this->DisableArrayBTree == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x4f] == true) {
    Output::Print(L"-%s",L"DisableRentalThreading");
    if (this->DisableRentalThreading == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x50] == true) {
    Output::Print(L"-%s",L"DisableVTuneSourceLineInfo");
    if (this->DisableVTuneSourceLineInfo == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x51] == true) {
    Output::Print(L"-%s",L"DisplayMemStats");
    if (this->DisplayMemStats == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x52] == true) {
    Output::Print(L"-%s",L"Dump");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x53] == true) {
    Output::Print(L"-%s",L"DumpIRAddresses");
    if (this->DumpIRAddresses == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x54] == true) {
    Output::Print(L"-%s",L"DumpLineNoInColor");
    if (this->DumpLineNoInColor == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x55] == true) {
    Output::Print(L"-%s",L"DumpObjectGraphOnExit");
    if (this->DumpObjectGraphOnExit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x56] == true) {
    Output::Print(L"-%s",L"DumpObjectGraphOnCollect");
    if (this->DumpObjectGraphOnCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x57] == true) {
    Output::Print(L"-%s",L"DumpEvalStringOnRemoval");
    if (this->DumpEvalStringOnRemoval == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x58] == true) {
    Output::Print(L"-%s",L"DumpObjectGraphOnEnum");
    if (this->DumpObjectGraphOnEnum == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x59] == true) {
    Output::Print(L"-%s",L"DynamicProfileCache");
    Output::Print(L":%s",(this->DynamicProfileCache).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5a] == true) {
    Output::Print(L"-%s",L"Dpc");
    Output::Print(L":%s",(this->Dpc).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5b] == true) {
    Output::Print(L"-%s",L"DynamicProfileCacheDir");
    Output::Print(L":%s",(this->DynamicProfileCacheDir).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5c] == true) {
    Output::Print(L"-%s",L"DynamicProfileInput");
    Output::Print(L":%s",(this->DynamicProfileInput).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5d] == true) {
    Output::Print(L"-%s",L"Dpi");
    Output::Print(L":%s",(this->Dpi).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5e] == true) {
    Output::Print(L"-%s",L"WininetProfileCache");
    if (this->WininetProfileCache == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x5f] == true) {
    Output::Print(L"-%s",L"NoDynamicProfileInMemoryCache");
    if (this->NoDynamicProfileInMemoryCache == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x60] == true) {
    Output::Print(L"-%s",L"ProfileBasedSpeculativeJit");
    if (this->ProfileBasedSpeculativeJit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x61] == true) {
    Output::Print(L"-%s",L"ProfileBasedSpeculationCap");
    Output::Print(L":%d",(ulong)(uint)this->ProfileBasedSpeculationCap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x62] == true) {
    Output::Print(L"-%s",L"DynamicProfileMutatorDll");
    Output::Print(L":%s",(this->DynamicProfileMutatorDll).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[99] == true) {
    Output::Print(L"-%s",L"DynamicProfileMutator");
    Output::Print(L":%s",(this->DynamicProfileMutator).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[100] == true) {
    Output::Print(L"-%s",L"ExecuteByteCodeBufferReturnsInvalidByteCode");
    if (this->ExecuteByteCodeBufferReturnsInvalidByteCode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x65] == true) {
    Output::Print(L"-%s",L"ExpirableCollectionGCCount");
    Output::Print(L":%d",(ulong)(uint)this->ExpirableCollectionGCCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x66] == true) {
    Output::Print(L"-%s",L"ExpirableCollectionTriggerThreshold");
    Output::Print(L":%d",(ulong)(uint)this->ExpirableCollectionTriggerThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x67] == true) {
    Output::Print(L"-%s",L"SkipSplitOnNoResult");
    if (this->SkipSplitOnNoResult == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x68] == true) {
    Output::Print(L"-%s",L"Force32BitByteCode");
    if (this->Force32BitByteCode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x69] == true) {
    Output::Print(L"-%s",L"CollectGarbage");
    if (this->CollectGarbage == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6a] == true) {
    Output::Print(L"-%s",L"Intl");
    if (this->Intl == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6b] == true) {
    Output::Print(L"-%s",L"IntlBuiltIns");
    if (this->IntlBuiltIns == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6c] == true) {
    Output::Print(L"-%s",L"IntlPlatform");
    if (this->IntlPlatform == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6d] == true) {
    Output::Print(L"-%s",L"JsBuiltIn");
    if (this->JsBuiltIn == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6e] == true) {
    Output::Print(L"-%s",L"JitRepro");
    if (this->JitRepro == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x6f] == true) {
    Output::Print(L"-%s",L"EntryPointInfoRpcData");
    if (this->EntryPointInfoRpcData == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x70] == true) {
    Output::Print(L"-%s",L"LdChakraLib");
    if (this->LdChakraLib == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x71] == true) {
    Output::Print(L"-%s",L"TestChakraLib");
    if (this->TestChakraLib == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x72] == true) {
    Output::Print(L"-%s",L"ES6");
    if (this->ES6 == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x73] == true) {
    Output::Print(L"-%s",L"ES6All");
    if (this->ES6All == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x74] == true) {
    Output::Print(L"-%s",L"ES6Experimental");
    if (this->ES6Experimental == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x75] == true) {
    Output::Print(L"-%s",L"ES7AsyncAwait");
    if (this->ES7AsyncAwait == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x76] == true) {
    Output::Print(L"-%s",L"ES6DateParseFix");
    if (this->ES6DateParseFix == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x77] == true) {
    Output::Print(L"-%s",L"ES6FunctionNameFull");
    if (this->ES6FunctionNameFull == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x78] == true) {
    Output::Print(L"-%s",L"ES6Generators");
    if (this->ES6Generators == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x79] == true) {
    Output::Print(L"-%s",L"ES7ExponentiationOperator");
    if (this->ES7ExponentiationOperator == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7a] == true) {
    Output::Print(L"-%s",L"ES7ValuesEntries");
    if (this->ES7ValuesEntries == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7b] == true) {
    Output::Print(L"-%s",L"ES7TrailingComma");
    if (this->ES7TrailingComma == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7c] == true) {
    Output::Print(L"-%s",L"ES6IsConcatSpreadable");
    if (this->ES6IsConcatSpreadable == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7d] == true) {
    Output::Print(L"-%s",L"ES6Math");
    if (this->ES6Math == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7e] == true) {
    Output::Print(L"-%s",L"ESDynamicImport");
    if (this->ESDynamicImport == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x7f] == true) {
    Output::Print(L"-%s",L"ES6Module");
    if (this->ES6Module == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x80] == true) {
    Output::Print(L"-%s",L"ES6Object");
    if (this->ES6Object == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x81] == true) {
    Output::Print(L"-%s",L"ES6Number");
    if (this->ES6Number == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x82] == true) {
    Output::Print(L"-%s",L"ES6ObjectLiterals");
    if (this->ES6ObjectLiterals == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x83] == true) {
    Output::Print(L"-%s",L"ES6Proxy");
    if (this->ES6Proxy == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x84] == true) {
    Output::Print(L"-%s",L"ES6Rest");
    if (this->ES6Rest == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x85] == true) {
    Output::Print(L"-%s",L"ES6Spread");
    if (this->ES6Spread == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x86] == true) {
    Output::Print(L"-%s",L"ES6String");
    if (this->ES6String == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x87] == true) {
    Output::Print(L"-%s",L"ES6StringPrototypeFixes");
    if (this->ES6StringPrototypeFixes == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x88] == true) {
    Output::Print(L"-%s",L"ES2018ObjectRestSpread");
    if (this->ES2018ObjectRestSpread == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x89] == true) {
    Output::Print(L"-%s",L"ES6PrototypeChain");
    if (this->ES6PrototypeChain == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8a] == true) {
    Output::Print(L"-%s",L"ES6ToPrimitive");
    if (this->ES6ToPrimitive == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8b] == true) {
    Output::Print(L"-%s",L"ES6ToLength");
    if (this->ES6ToLength == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8c] == true) {
    Output::Print(L"-%s",L"ES6ToStringTag");
    if (this->ES6ToStringTag == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8d] == true) {
    Output::Print(L"-%s",L"ES6Unicode");
    if (this->ES6Unicode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8e] == true) {
    Output::Print(L"-%s",L"ES6UnicodeVerbose");
    if (this->ES6UnicodeVerbose == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x8f] == true) {
    Output::Print(L"-%s",L"ES6Unscopables");
    if (this->ES6Unscopables == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x90] == true) {
    Output::Print(L"-%s",L"ES6RegExSticky");
    if (this->ES6RegExSticky == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x91] == true) {
    Output::Print(L"-%s",L"ES2018RegExDotAll");
    if (this->ES2018RegExDotAll == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x92] == true) {
    Output::Print(L"-%s",L"ESExportNsAs");
    if (this->ESExportNsAs == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x93] == true) {
    Output::Print(L"-%s",L"ES2018AsyncIteration");
    if (this->ES2018AsyncIteration == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x94] == true) {
    Output::Print(L"-%s",L"ESTopLevelAwait");
    if (this->ESTopLevelAwait == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x95] == true) {
    Output::Print(L"-%s",L"ES6RegExPrototypeProperties");
    if (this->ES6RegExPrototypeProperties == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x96] == true) {
    Output::Print(L"-%s",L"ES6RegExSymbols");
    if (this->ES6RegExSymbols == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x97] == true) {
    Output::Print(L"-%s",L"ES6Verbose");
    if (this->ES6Verbose == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x98] == true) {
    Output::Print(L"-%s",L"ESObjectGetOwnPropertyDescriptors");
    if (this->ESObjectGetOwnPropertyDescriptors == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x99] == true) {
    Output::Print(L"-%s",L"ESSharedArrayBuffer");
    if (this->ESSharedArrayBuffer == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9a] == true) {
    Output::Print(L"-%s",L"ESBigInt");
    if (this->ESBigInt == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9b] == true) {
    Output::Print(L"-%s",L"ESNumericSeparator");
    if (this->ESNumericSeparator == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9c] == true) {
    Output::Print(L"-%s",L"ESNullishCoalescingOperator");
    if (this->ESNullishCoalescingOperator == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9d] == true) {
    Output::Print(L"-%s",L"ESHashbang");
    if (this->ESHashbang == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9e] == true) {
    Output::Print(L"-%s",L"ESSymbolDescription");
    if (this->ESSymbolDescription == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x9f] == true) {
    Output::Print(L"-%s",L"ESArrayFindFromLast");
    if (this->ESArrayFindFromLast == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa0] == true) {
    Output::Print(L"-%s",L"ESPromiseAny");
    if (this->ESPromiseAny == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa1] == true) {
    Output::Print(L"-%s",L"ESImportMeta");
    if (this->ESImportMeta == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa2] == true) {
    Output::Print(L"-%s",L"ESGlobalThis");
    if (this->ESGlobalThis == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa3] == true) {
    Output::Print(L"-%s",L"JitES6Generators");
    if (this->JitES6Generators == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa4] == true) {
    Output::Print(L"-%s",L"FastLineColumnCalculation");
    if (this->FastLineColumnCalculation == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa5] == true) {
    Output::Print(L"-%s",L"Filename");
    Output::Print(L":%s",(this->Filename).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa6] == true) {
    Output::Print(L"-%s",L"FreeRejittedCode");
    if (this->FreeRejittedCode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa7] == true) {
    Output::Print(L"-%s",L"ForceGuardPages");
    if (this->ForceGuardPages == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa8] == true) {
    Output::Print(L"-%s",L"PrintGuardPageBounds");
    if (this->PrintGuardPageBounds == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xa9] == true) {
    Output::Print(L"-%s",L"ForceLegacyEngine");
    if (this->ForceLegacyEngine == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xaa] == true) {
    Output::Print(L"-%s",L"Force");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xab] == true) {
    Output::Print(L"-%s",L"Stress");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xac] == true) {
    Output::Print(L"-%s",L"ForceArrayBTree");
    if (this->ForceArrayBTree == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xad] == true) {
    Output::Print(L"-%s",L"StrongArraySort");
    if (this->StrongArraySort == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xae] == true) {
    Output::Print(L"-%s",L"ForceCleanPropertyOnCollect");
    if (this->ForceCleanPropertyOnCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xaf] == true) {
    Output::Print(L"-%s",L"ForceCleanCacheOnCollect");
    if (this->ForceCleanCacheOnCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb0] == true) {
    Output::Print(L"-%s",L"ForceGCAfterJSONParse");
    if (this->ForceGCAfterJSONParse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb1] == true) {
    Output::Print(L"-%s",L"ForceDecommitOnCollect");
    if (this->ForceDecommitOnCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb2] == true) {
    Output::Print(L"-%s",L"ForceDeferParse");
    if (this->ForceDeferParse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb3] == true) {
    Output::Print(L"-%s",L"ForceDiagnosticsMode");
    if (this->ForceDiagnosticsMode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb4] == true) {
    Output::Print(L"-%s",L"ForceGetWriteWatchOOM");
    if (this->ForceGetWriteWatchOOM == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb5] == true) {
    Output::Print(L"-%s",L"ForcePostLowerGlobOptInstrString");
    if (this->ForcePostLowerGlobOptInstrString == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb6] == true) {
    Output::Print(L"-%s",L"ForceSplitScope");
    if (this->ForceSplitScope == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb7] == true) {
    Output::Print(L"-%s",L"EnumerateSpecialPropertiesInDebugger");
    if (this->EnumerateSpecialPropertiesInDebugger == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb8] == true) {
    Output::Print(L"-%s",L"EnableContinueAfterExceptionWrappersForHelpers");
    if (this->EnableContinueAfterExceptionWrappersForHelpers == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xb9] == true) {
    Output::Print(L"-%s",L"EnableContinueAfterExceptionWrappersForBuiltIns");
    if (this->EnableContinueAfterExceptionWrappersForBuiltIns == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xba] == true) {
    Output::Print(L"-%s",L"EnableFunctionSourceReportForHeapEnum");
    if (this->EnableFunctionSourceReportForHeapEnum == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xbb] == true) {
    Output::Print(L"-%s",L"ForceFragmentAddressSpace");
    Output::Print(L":%d",(ulong)(uint)this->ForceFragmentAddressSpace);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xbc] == true) {
    Output::Print(L"-%s",L"ForceOOMOnEBCommit");
    Output::Print(L":%d",(ulong)(uint)this->ForceOOMOnEBCommit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xbd] == true) {
    Output::Print(L"-%s",L"ForceDynamicProfile");
    if (this->ForceDynamicProfile == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xbe] == true) {
    Output::Print(L"-%s",L"ForceES5Array");
    if (this->ForceES5Array == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xbf] == true) {
    Output::Print(L"-%s",L"ForceAsmJsLinkFail");
    if (this->ForceAsmJsLinkFail == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc0] == true) {
    Output::Print(L"-%s",L"ForceExpireOnNonCacheCollect");
    if (this->ForceExpireOnNonCacheCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc1] == true) {
    Output::Print(L"-%s",L"ForceFastPath");
    if (this->ForceFastPath == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc2] == true) {
    Output::Print(L"-%s",L"ForceFloatPref");
    if (this->ForceFloatPref == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc3] == true) {
    Output::Print(L"-%s",L"ForceJITLoopBody");
    if (this->ForceJITLoopBody == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc4] == true) {
    Output::Print(L"-%s",L"ForceStaticInterpreterThunk");
    if (this->ForceStaticInterpreterThunk == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc5] == true) {
    Output::Print(L"-%s",L"DumpCommentsFromReferencedFiles");
    if (this->DumpCommentsFromReferencedFiles == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc6] == true) {
    Output::Print(L"-%s",L"DelayFullJITSmallFunc");
    Output::Print(L":%d",(ulong)(uint)this->DelayFullJITSmallFunc);
    Output::Print(L"\n");
  }
  if (this->flagPresent[199] == true) {
    Output::Print(L"-%s",L"EnableFatalErrorOnOOM");
    if (this->EnableFatalErrorOnOOM == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[200] == true) {
    Output::Print(L"-%s",L"DeferLoadingAvailableSource");
    if (this->DeferLoadingAvailableSource == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xc9] == true) {
    Output::Print(L"-%s",L"ForceNative");
    if (this->ForceNative == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xca] == true) {
    Output::Print(L"-%s",L"ForceSerialized");
    if (this->ForceSerialized == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xcb] == true) {
    Output::Print(L"-%s",L"ForceSerializedBytecodeMajorVersion");
    Output::Print(L":%d",(ulong)(uint)this->ForceSerializedBytecodeMajorVersion);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xcc] == true) {
    Output::Print(L"-%s",L"ForceSerializedBytecodeVersionSchema");
    Output::Print(L":%d",(ulong)(uint)this->ForceSerializedBytecodeVersionSchema);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xcd] == true) {
    Output::Print(L"-%s",L"ForceStrictMode");
    if (this->ForceStrictMode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xce] == true) {
    Output::Print(L"-%s",L"ForceUndoDefer");
    if (this->ForceUndoDefer == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xcf] == true) {
    Output::Print(L"-%s",L"ForceBlockingConcurrentCollect");
    if (this->ForceBlockingConcurrentCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd0] == true) {
    Output::Print(L"-%s",L"FreTestDiagMode");
    if (this->FreTestDiagMode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd1] == true) {
    Output::Print(L"-%s",L"ByteCodeBranchLimit");
    Output::Print(L":%d",(ulong)(uint)this->ByteCodeBranchLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd2] == true) {
    Output::Print(L"-%s",L"MediumByteCodeLayout");
    if (this->MediumByteCodeLayout == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd3] == true) {
    Output::Print(L"-%s",L"LargeByteCodeLayout");
    if (this->LargeByteCodeLayout == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd4] == true) {
    Output::Print(L"-%s",L"InduceCodeGenFailure");
    Output::Print(L":%d",(ulong)(uint)this->InduceCodeGenFailure);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd5] == true) {
    Output::Print(L"-%s",L"InduceCodeGenFailureSeed");
    Output::Print(L":%d",(ulong)(uint)this->InduceCodeGenFailureSeed);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd6] == true) {
    Output::Print(L"-%s",L"InjectPartiallyInitializedInterpreterFrameError");
    Output::Print(L":%d",(ulong)(uint)this->InjectPartiallyInitializedInterpreterFrameError);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd7] == true) {
    Output::Print(L"-%s",L"InjectPartiallyInitializedInterpreterFrameErrorType");
    Output::Print(L":%d",(ulong)(uint)this->InjectPartiallyInitializedInterpreterFrameErrorType);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd8] == true) {
    Output::Print(L"-%s",L"GenerateByteCodeBufferReturnsCantGenerate");
    if (this->GenerateByteCodeBufferReturnsCantGenerate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xd9] == true) {
    Output::Print(L"-%s",L"GoptCleanupThreshold");
    Output::Print(L":%d",(ulong)(uint)this->GoptCleanupThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xda] == true) {
    Output::Print(L"-%s",L"AsmGoptCleanupThreshold");
    Output::Print(L":%d",(ulong)(uint)this->AsmGoptCleanupThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xdb] == true) {
    Output::Print(L"-%s",L"HighPrecisionDate");
    if (this->HighPrecisionDate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xdc] == true) {
    Output::Print(L"-%s",L"InlineCountMax");
    Output::Print(L":%d",(ulong)(uint)this->InlineCountMax);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xdd] == true) {
    Output::Print(L"-%s",L"InlineCountMaxInLoopBodies");
    Output::Print(L":%d",(ulong)(uint)this->InlineCountMaxInLoopBodies);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xde] == true) {
    Output::Print(L"-%s",L"icminlb");
    Output::Print(L":%d",(ulong)(uint)this->icminlb);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xdf] == true) {
    Output::Print(L"-%s",L"InlineInLoopBodyScaleDownFactor");
    Output::Print(L":%d",(ulong)(uint)this->InlineInLoopBodyScaleDownFactor);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe0] == true) {
    Output::Print(L"-%s",L"iilbsdf");
    Output::Print(L":%d",(ulong)(uint)this->iilbsdf);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe1] == true) {
    Output::Print(L"-%s",L"InlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->InlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe2] == true) {
    Output::Print(L"-%s",L"AggressiveInlineCountMax");
    Output::Print(L":%d",(ulong)(uint)this->AggressiveInlineCountMax);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe3] == true) {
    Output::Print(L"-%s",L"AggressiveInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->AggressiveInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe4] == true) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInLargeFunction");
    Output::Print(L":%d",(ulong)(uint)this->InlineThresholdAdjustCountInLargeFunction);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe5] == true) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInMediumSizedFunction");
    Output::Print(L":%d",(ulong)(uint)this->InlineThresholdAdjustCountInMediumSizedFunction);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe6] == true) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInSmallFunction");
    Output::Print(L":%d",(ulong)(uint)this->InlineThresholdAdjustCountInSmallFunction);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe7] == true) {
    Output::Print(L"-%s",L"AsmJsInlineAdjust");
    Output::Print(L":%d",(ulong)(uint)this->AsmJsInlineAdjust);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe8] == true) {
    Output::Print(L"-%s",L"Interpret");
    Output::Print(L":%s",(this->Interpret).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xe9] == true) {
    Output::Print(L"-%s",L"Instrument");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xea] == true) {
    Output::Print(L"-%s",L"JitQueueThreshold");
    Output::Print(L":%d",(ulong)(uint)this->JitQueueThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xeb] == true) {
    Output::Print(L"-%s",L"LeakReport");
    Output::Print(L":%s",(this->LeakReport).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xec] == true) {
    Output::Print(L"-%s",L"LoopInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->LoopInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xed] == true) {
    Output::Print(L"-%s",L"LeafInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->LeafInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xee] == true) {
    Output::Print(L"-%s",L"ConstantArgumentInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->ConstantArgumentInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xef] == true) {
    Output::Print(L"-%s",L"RecursiveInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->RecursiveInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf0] == true) {
    Output::Print(L"-%s",L"RecursiveInlineDepthMax");
    Output::Print(L":%d",(ulong)(uint)this->RecursiveInlineDepthMax);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf1] == true) {
    Output::Print(L"-%s",L"RecursiveInlineDepthMin");
    Output::Print(L":%d",(ulong)(uint)this->RecursiveInlineDepthMin);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf2] == true) {
    Output::Print(L"-%s",L"RedeferralCap");
    Output::Print(L":%d",(ulong)(uint)this->RedeferralCap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf3] == true) {
    Output::Print(L"-%s",L"Loop");
    Output::Print(L":%d",(ulong)(uint)this->Loop);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf4] == true) {
    Output::Print(L"-%s",L"LoopInterpretCount");
    Output::Print(L":%d",(ulong)(uint)this->LoopInterpretCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf5] == true) {
    Output::Print(L"-%s",L"lic");
    Output::Print(L":%d",(ulong)(uint)this->lic);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf6] == true) {
    Output::Print(L"-%s",L"LoopProfileIterations");
    Output::Print(L":%d",(ulong)(uint)this->LoopProfileIterations);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf7] == true) {
    Output::Print(L"-%s",L"OutsideLoopInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->OutsideLoopInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf8] == true) {
    Output::Print(L"-%s",L"MaxFuncInlineDepth");
    Output::Print(L":%d",(ulong)(uint)this->MaxFuncInlineDepth);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xf9] == true) {
    Output::Print(L"-%s",L"MaxNumberOfInlineesWithLoop");
    Output::Print(L":%d",(ulong)(uint)this->MaxNumberOfInlineesWithLoop);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xfa] == true) {
    Output::Print(L"-%s",L"Memspect");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xfb] == true) {
    Output::Print(L"-%s",L"PolymorphicInlineThreshold");
    Output::Print(L":%d",(ulong)(uint)this->PolymorphicInlineThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xfc] == true) {
    Output::Print(L"-%s",L"PrimeRecycler");
    if (this->PrimeRecycler == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xfd] == true) {
    Output::Print(L"-%s",L"PrivateHeap");
    if (this->PrivateHeap == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xfe] == true) {
    Output::Print(L"-%s",L"TraceEngineRefcount");
    if (this->TraceEngineRefcount == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0xff] == true) {
    Output::Print(L"-%s",L"LeakStackTrace");
    if (this->LeakStackTrace == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x100] == true) {
    Output::Print(L"-%s",L"ForceMemoryLeak");
    if (this->ForceMemoryLeak == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x101] == true) {
    Output::Print(L"-%s",L"DumpAfterFinalGC");
    if (this->DumpAfterFinalGC == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x102] == true) {
    Output::Print(L"-%s",L"ForceOldDateAPI");
    if (this->ForceOldDateAPI == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x103] == true) {
    Output::Print(L"-%s",L"JitLoopBodyHotLoopThreshold");
    Output::Print(L":%d",(ulong)(uint)this->JitLoopBodyHotLoopThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x104] == true) {
    Output::Print(L"-%s",L"LoopBodySizeThresholdToDisableOpts");
    Output::Print(L":%d",(ulong)(uint)this->LoopBodySizeThresholdToDisableOpts);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x105] == true) {
    Output::Print(L"-%s",L"MaxJitThreadCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxJitThreadCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x106] == true) {
    Output::Print(L"-%s",L"ForceMaxJitThreadCount");
    if (this->ForceMaxJitThreadCount == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x107] == true) {
    Output::Print(L"-%s",L"MitigateSpectre");
    if (this->MitigateSpectre == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x108] == true) {
    Output::Print(L"-%s",L"AddMaskingBlocks");
    if (this->AddMaskingBlocks == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x109] == true) {
    Output::Print(L"-%s",L"PoisonVarArrayLoad");
    if (this->PoisonVarArrayLoad == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10a] == true) {
    Output::Print(L"-%s",L"PoisonIntArrayLoad");
    if (this->PoisonIntArrayLoad == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10b] == true) {
    Output::Print(L"-%s",L"PoisonFloatArrayLoad");
    if (this->PoisonFloatArrayLoad == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10c] == true) {
    Output::Print(L"-%s",L"PoisonTypedArrayLoad");
    if (this->PoisonTypedArrayLoad == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10d] == true) {
    Output::Print(L"-%s",L"PoisonStringLoad");
    if (this->PoisonStringLoad == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10e] == true) {
    Output::Print(L"-%s",L"PoisonObjectsForLoads");
    if (this->PoisonObjectsForLoads == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x10f] == true) {
    Output::Print(L"-%s",L"PoisonVarArrayStore");
    if (this->PoisonVarArrayStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x110] == true) {
    Output::Print(L"-%s",L"PoisonIntArrayStore");
    if (this->PoisonIntArrayStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x111] == true) {
    Output::Print(L"-%s",L"PoisonFloatArrayStore");
    if (this->PoisonFloatArrayStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x112] == true) {
    Output::Print(L"-%s",L"PoisonTypedArrayStore");
    if (this->PoisonTypedArrayStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x113] == true) {
    Output::Print(L"-%s",L"PoisonStringStore");
    if (this->PoisonStringStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x114] == true) {
    Output::Print(L"-%s",L"PoisonObjectsForStores");
    if (this->PoisonObjectsForStores == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x115] == true) {
    Output::Print(L"-%s",L"MinInterpretCount");
    Output::Print(L":%d",(ulong)(uint)this->MinInterpretCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x116] == true) {
    Output::Print(L"-%s",L"MinSimpleJitRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MinSimpleJitRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x117] == true) {
    Output::Print(L"-%s",L"MaxInterpretCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxInterpretCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x118] == true) {
    Output::Print(L"-%s",L"Mic");
    Output::Print(L":%d",(ulong)(uint)this->Mic);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x119] == true) {
    Output::Print(L"-%s",L"MaxSimpleJitRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxSimpleJitRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11a] == true) {
    Output::Print(L"-%s",L"Msjrc");
    Output::Print(L":%d",(ulong)(uint)this->Msjrc);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11b] == true) {
    Output::Print(L"-%s",L"MinMemOpCount");
    Output::Print(L":%d",(ulong)(uint)this->MinMemOpCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11c] == true) {
    Output::Print(L"-%s",L"Mmoc");
    Output::Print(L":%d",(ulong)(uint)this->Mmoc);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11d] == true) {
    Output::Print(L"-%s",L"MaxCopyOnAccessArrayLength");
    Output::Print(L":%d",(ulong)(uint)this->MaxCopyOnAccessArrayLength);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11e] == true) {
    Output::Print(L"-%s",L"MinCopyOnAccessArrayLength");
    Output::Print(L":%d",(ulong)(uint)this->MinCopyOnAccessArrayLength);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x11f] == true) {
    Output::Print(L"-%s",L"CopyOnAccessArraySegmentCacheSize");
    Output::Print(L":%d",(ulong)(uint)this->CopyOnAccessArraySegmentCacheSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x120] == true) {
    Output::Print(L"-%s",L"MinTemplatizedJitRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MinTemplatizedJitRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x121] == true) {
    Output::Print(L"-%s",L"MinAsmJsInterpreterRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MinAsmJsInterpreterRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x122] == true) {
    Output::Print(L"-%s",L"MinTemplatizedJitLoopRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MinTemplatizedJitLoopRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x123] == true) {
    Output::Print(L"-%s",L"MaxTemplatizedJitRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxTemplatizedJitRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x124] == true) {
    Output::Print(L"-%s",L"Mtjrc");
    Output::Print(L":%d",(ulong)(uint)this->Mtjrc);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x125] == true) {
    Output::Print(L"-%s",L"MaxAsmJsInterpreterRunCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxAsmJsInterpreterRunCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x126] == true) {
    Output::Print(L"-%s",L"Maic");
    Output::Print(L":%d",(ulong)(uint)this->Maic);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x127] == true) {
    Output::Print(L"-%s",L"AutoProfilingInterpreter0Limit");
    Output::Print(L":%d",(ulong)(uint)this->AutoProfilingInterpreter0Limit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x128] == true) {
    Output::Print(L"-%s",L"ProfilingInterpreter0Limit");
    Output::Print(L":%d",(ulong)(uint)this->ProfilingInterpreter0Limit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x129] == true) {
    Output::Print(L"-%s",L"AutoProfilingInterpreter1Limit");
    Output::Print(L":%d",(ulong)(uint)this->AutoProfilingInterpreter1Limit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x12a] == true) {
    Output::Print(L"-%s",L"SimpleJitLimit");
    Output::Print(L":%d",(ulong)(uint)this->SimpleJitLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[299] == true) {
    Output::Print(L"-%s",L"ProfilingInterpreter1Limit");
    Output::Print(L":%d",(ulong)(uint)this->ProfilingInterpreter1Limit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[300] == true) {
    Output::Print(L"-%s",L"ExecutionModeLimits");
    Output::Print(L":%s",(this->ExecutionModeLimits).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x12d] == true) {
    Output::Print(L"-%s",L"Eml");
    Output::Print(L":%s",(this->Eml).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x12e] == true) {
    Output::Print(L"-%s",L"EnforceExecutionModeLimits");
    if (this->EnforceExecutionModeLimits == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x12f] == true) {
    Output::Print(L"-%s",L"Eeml");
    if (this->Eeml == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x130] == true) {
    Output::Print(L"-%s",L"SimpleJitAfter");
    Output::Print(L":%d",(ulong)(uint)this->SimpleJitAfter);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x131] == true) {
    Output::Print(L"-%s",L"Sja");
    Output::Print(L":%d",(ulong)(uint)this->Sja);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x132] == true) {
    Output::Print(L"-%s",L"FullJitAfter");
    Output::Print(L":%d",(ulong)(uint)this->FullJitAfter);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x133] == true) {
    Output::Print(L"-%s",L"Fja");
    Output::Print(L":%d",(ulong)(uint)this->Fja);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x134] == true) {
    Output::Print(L"-%s",L"NewSimpleJit");
    if (this->NewSimpleJit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x135] == true) {
    Output::Print(L"-%s",L"MaxLinearIntCaseCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxLinearIntCaseCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x136] == true) {
    Output::Print(L"-%s",L"MaxSingleCharStrJumpTableSize");
    Output::Print(L":%d",(ulong)(uint)this->MaxSingleCharStrJumpTableSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x137] == true) {
    Output::Print(L"-%s",L"MaxSingleCharStrJumpTableRatio");
    Output::Print(L":%d",(ulong)(uint)this->MaxSingleCharStrJumpTableRatio);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x138] == true) {
    Output::Print(L"-%s",L"MinSwitchJumpTableSize");
    Output::Print(L":%d",(ulong)(uint)this->MinSwitchJumpTableSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x139] == true) {
    Output::Print(L"-%s",L"MaxLinearStringCaseCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxLinearStringCaseCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13a] == true) {
    Output::Print(L"-%s",L"MinDeferredFuncTokenCount");
    Output::Print(L":%d",(ulong)(uint)this->MinDeferredFuncTokenCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13b] == true) {
    Output::Print(L"-%s",L"SkipFuncCountForBailOnNoProfile");
    Output::Print(L":%d",(ulong)(uint)this->SkipFuncCountForBailOnNoProfile);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13c] == true) {
    Output::Print(L"-%s",L"MaxJITFunctionBytecodeByteLength");
    Output::Print(L":%d",(ulong)(uint)this->MaxJITFunctionBytecodeByteLength);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13d] == true) {
    Output::Print(L"-%s",L"MaxJITFunctionBytecodeCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxJITFunctionBytecodeCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13e] == true) {
    Output::Print(L"-%s",L"MaxLoopsPerFunction");
    Output::Print(L":%d",(ulong)(uint)this->MaxLoopsPerFunction);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x13f] == true) {
    Output::Print(L"-%s",L"FuncObjectInlineCacheThreshold");
    Output::Print(L":%d",(ulong)(uint)this->FuncObjectInlineCacheThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x140] == true) {
    Output::Print(L"-%s",L"NoDeferParse");
    if (this->NoDeferParse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x141] == true) {
    Output::Print(L"-%s",L"NoLogo");
    if (this->NoLogo == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x142] == true) {
    Output::Print(L"-%s",L"OOPJITMissingOpts");
    if (this->OOPJITMissingOpts == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x143] == true) {
    Output::Print(L"-%s",L"CrashOnOOPJITFailure");
    if (this->CrashOnOOPJITFailure == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x144] == true) {
    Output::Print(L"-%s",L"OOPCFGRegistration");
    if (this->OOPCFGRegistration == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x145] == true) {
    Output::Print(L"-%s",L"ForceJITCFGCheck");
    if (this->ForceJITCFGCheck == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x146] == true) {
    Output::Print(L"-%s",L"UseJITTrampoline");
    if (this->UseJITTrampoline == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x147] == true) {
    Output::Print(L"-%s",L"NoNative");
    if (this->NoNative == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x148] == true) {
    Output::Print(L"-%s",L"NopFrequency");
    Output::Print(L":%d",(ulong)(uint)this->NopFrequency);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x149] == true) {
    Output::Print(L"-%s",L"NoStrictMode");
    if (this->NoStrictMode == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14a] == true) {
    Output::Print(L"-%s",L"NormalizeStats");
    if (this->NormalizeStats == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14b] == true) {
    Output::Print(L"-%s",L"Off");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14c] == true) {
    Output::Print(L"-%s",L"OffProfiledByteCode");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14d] == true) {
    Output::Print(L"-%s",L"On");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14e] == true) {
    Output::Print(L"-%s",L"OutputFile");
    Output::Print(L":%s",(this->OutputFile).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x14f] == true) {
    Output::Print(L"-%s",L"OutputFileOpenMode");
    Output::Print(L":%s",(this->OutputFileOpenMode).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x150] == true) {
    Output::Print(L"-%s",L"InMemoryTrace");
    if (this->InMemoryTrace == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x151] == true) {
    Output::Print(L"-%s",L"InMemoryTraceBufferSize");
    Output::Print(L":%d",(ulong)(uint)this->InMemoryTraceBufferSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x152] == true) {
    Output::Print(L"-%s",L"TraceWithStack");
    if (this->TraceWithStack == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x153] == true) {
    Output::Print(L"-%s",L"PrintRunTimeDataCollectionTrace");
    if (this->PrintRunTimeDataCollectionTrace == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x154] == true) {
    Output::Print(L"-%s",L"Prejit");
    if (this->Prejit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x155] == true) {
    Output::Print(L"-%s",L"PrintSrcInDump");
    if (this->PrintSrcInDump == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x156] == true) {
    Output::Print(L"-%s",L"ProfileDictionary");
    Output::Print(L":%d",(ulong)(uint)this->ProfileDictionary);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x157] == true) {
    Output::Print(L"-%s",L"Profile");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x158] == true) {
    Output::Print(L"-%s",L"ProfileThreshold");
    Output::Print(L":%d",(ulong)(uint)this->ProfileThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x159] == true) {
    Output::Print(L"-%s",L"ProfileObjectLiteral");
    if (this->ProfileObjectLiteral == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15a] == true) {
    Output::Print(L"-%s",L"ProfileMemory");
    Output::Print(L":%s",(this->ProfileMemory).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15b] == true) {
    Output::Print(L"-%s",L"ProfileStrings");
    if (this->ProfileStrings == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15c] == true) {
    Output::Print(L"-%s",L"ProfileTypes");
    if (this->ProfileTypes == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15d] == true) {
    Output::Print(L"-%s",L"ProfileEvalMap");
    if (this->ProfileEvalMap == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15e] == true) {
    Output::Print(L"-%s",L"ProfileBailOutRecordMemory");
    if (this->ProfileBailOutRecordMemory == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x15f] == true) {
    Output::Print(L"-%s",L"ValidateIntRanges");
    if (this->ValidateIntRanges == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x160] == true) {
    Output::Print(L"-%s",L"RejitMaxBailOutCount");
    Output::Print(L":%d",(ulong)(uint)this->RejitMaxBailOutCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x161] == true) {
    Output::Print(L"-%s",L"CallsToBailoutsRatioForRejit");
    Output::Print(L":%d",(ulong)(uint)this->CallsToBailoutsRatioForRejit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x162] == true) {
    Output::Print(L"-%s",L"LoopIterationsToBailoutsRatioForRejit");
    Output::Print(L":%d",(ulong)(uint)this->LoopIterationsToBailoutsRatioForRejit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x163] == true) {
    Output::Print(L"-%s",L"MinBailOutsBeforeRejit");
    Output::Print(L":%d",(ulong)(uint)this->MinBailOutsBeforeRejit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x164] == true) {
    Output::Print(L"-%s",L"MinBailOutsBeforeRejitForLoops");
    Output::Print(L":%d",(ulong)(uint)this->MinBailOutsBeforeRejitForLoops);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x165] == true) {
    Output::Print(L"-%s",L"LibraryStackFrame");
    if (this->LibraryStackFrame == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x166] == true) {
    Output::Print(L"-%s",L"LibraryStackFrameDebugger");
    if (this->LibraryStackFrameDebugger == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x167] == true) {
    Output::Print(L"-%s",L"RecyclerStress");
    if (this->RecyclerStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x168] == true) {
    Output::Print(L"-%s",L"RecyclerBackgroundStress");
    if (this->RecyclerBackgroundStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x169] == true) {
    Output::Print(L"-%s",L"RecyclerConcurrentStress");
    if (this->RecyclerConcurrentStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16a] == true) {
    Output::Print(L"-%s",L"RecyclerConcurrentRepeatStress");
    if (this->RecyclerConcurrentRepeatStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16b] == true) {
    Output::Print(L"-%s",L"RecyclerPartialStress");
    if (this->RecyclerPartialStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16c] == true) {
    Output::Print(L"-%s",L"RecyclerTrackStress");
    if (this->RecyclerTrackStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16d] == true) {
    Output::Print(L"-%s",L"RecyclerInduceFalsePositives");
    if (this->RecyclerInduceFalsePositives == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16e] == true) {
    Output::Print(L"-%s",L"RecyclerForceMarkInterior");
    if (this->RecyclerForceMarkInterior == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x16f] == true) {
    Output::Print(L"-%s",L"RecyclerPriorityBoostTimeout");
    Output::Print(L":%d",(ulong)(uint)this->RecyclerPriorityBoostTimeout);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x170] == true) {
    Output::Print(L"-%s",L"RecyclerThreadCollectTimeout");
    Output::Print(L":%d",(ulong)(uint)this->RecyclerThreadCollectTimeout);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x171] == true) {
    Output::Print(L"-%s",L"EnableConcurrentSweepAlloc");
    if (this->EnableConcurrentSweepAlloc == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x172] == true) {
    Output::Print(L"-%s",L"ecsa");
    if (this->ecsa == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x173] == true) {
    Output::Print(L"-%s",L"PageHeap");
    Output::Print(L":%d",(ulong)(uint)this->PageHeap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x174] == true) {
    Output::Print(L"-%s",L"PageHeapAllocStack");
    if (this->PageHeapAllocStack == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x175] == true) {
    Output::Print(L"-%s",L"PageHeapFreeStack");
    if (this->PageHeapFreeStack == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x176] == true) {
    Output::Print(L"-%s",L"PageHeapBucketNumber");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x177] == true) {
    Output::Print(L"-%s",L"PageHeapBlockType");
    Output::Print(L":%d",(ulong)(uint)this->PageHeapBlockType);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x178] == true) {
    Output::Print(L"-%s",L"PageHeapDecommitGuardPage");
    if (this->PageHeapDecommitGuardPage == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x179] == true) {
    Output::Print(L"-%s",L"RecyclerNoPageReuse");
    if (this->RecyclerNoPageReuse == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17a] == true) {
    Output::Print(L"-%s",L"RecyclerVerify");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17b] == true) {
    Output::Print(L"-%s",L"RecyclerVerifyPadSize");
    Output::Print(L":%d",(ulong)(uint)this->RecyclerVerifyPadSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17c] == true) {
    Output::Print(L"-%s",L"RecyclerTest");
    if (this->RecyclerTest == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17d] == true) {
    Output::Print(L"-%s",L"RecyclerProtectPagesOnRescan");
    if (this->RecyclerProtectPagesOnRescan == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17e] == true) {
    Output::Print(L"-%s",L"RecyclerVerifyMark");
    if (this->RecyclerVerifyMark == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x17f] == true) {
    Output::Print(L"-%s",L"LowMemoryCap");
    Output::Print(L":%d",(ulong)(uint)this->LowMemoryCap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x180] == true) {
    Output::Print(L"-%s",L"NewPagesCapDuringBGSweeping");
    Output::Print(L":%d",(ulong)(uint)this->NewPagesCapDuringBGSweeping);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x181] == true) {
    Output::Print(L"-%s",L"AllocPolicyLimit");
    Output::Print(L":%d",(ulong)(uint)this->AllocPolicyLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x182] == true) {
    Output::Print(L"-%s",L"RuntimeDataOutputFile");
    Output::Print(L":%s",(this->RuntimeDataOutputFile).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x183] == true) {
    Output::Print(L"-%s",L"SpeculationCap");
    Output::Print(L":%d",(ulong)(uint)this->SpeculationCap);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x184] == true) {
    Output::Print(L"-%s",L"Stats");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x185] == true) {
    Output::Print(L"-%s",L"SwallowExceptions");
    if (this->SwallowExceptions == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x186] == true) {
    Output::Print(L"-%s",L"PrintSystemException");
    if (this->PrintSystemException == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x187] == true) {
    Output::Print(L"-%s",L"SwitchOptHolesThreshold");
    Output::Print(L":%d",(ulong)(uint)this->SwitchOptHolesThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x188] == true) {
    Output::Print(L"-%s",L"TempMin");
    Output::Print(L":%d",(ulong)(uint)this->TempMin);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x189] == true) {
    Output::Print(L"-%s",L"TempMax");
    Output::Print(L":%d",(ulong)(uint)this->TempMax);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18a] == true) {
    Output::Print(L"-%s",L"Trace");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18b] == true) {
    Output::Print(L"-%s",L"LoopAlignNopLimit");
    Output::Print(L":%d",(ulong)(uint)this->LoopAlignNopLimit);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18c] == true) {
    Output::Print(L"-%s",L"TraceMemory");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18d] == true) {
    Output::Print(L"-%s",L"TraceMetaDataParsing");
    Output::Print(L":%d",(ulong)(uint)this->TraceMetaDataParsing);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x18e] == true) {
    Output::Print(L"-%s",L"TraceWin8Allocations");
    if (this->TraceWin8Allocations == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[399] == true) {
    Output::Print(L"-%s",L"TraceWin8DeallocationsImmediate");
    if (this->TraceWin8DeallocationsImmediate == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[400] == true) {
    Output::Print(L"-%s",L"PrintWin8StatsDetailed");
    if (this->PrintWin8StatsDetailed == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x191] == true) {
    Output::Print(L"-%s",L"TraceProtectPages");
    if (this->TraceProtectPages == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x192] == true) {
    Output::Print(L"-%s",L"TraceAsyncDebugCalls");
    if (this->TraceAsyncDebugCalls == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x193] == true) {
    Output::Print(L"-%s",L"TrackDispatch");
    if (this->TrackDispatch == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x194] == true) {
    Output::Print(L"-%s",L"Verbose");
    if (this->Verbose == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x195] == true) {
    Output::Print(L"-%s",L"UseFullName");
    if (this->UseFullName == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x196] == true) {
    Output::Print(L"-%s",L"Utf8");
    if (this->Utf8 == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x197] == true) {
    Output::Print(L"-%s",L"Version");
    Output::Print(L":%d",(ulong)(uint)this->Version);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x198] == true) {
    Output::Print(L"-%s",L"WERExceptionSupport");
    if (this->WERExceptionSupport == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x199] == true) {
    Output::Print(L"-%s",L"ExtendedErrorStackForTestHost");
    if (this->ExtendedErrorStackForTestHost == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19a] == true) {
    Output::Print(L"-%s",L"errorStackTrace");
    if (this->errorStackTrace == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19b] == true) {
    Output::Print(L"-%s",L"DoHeapEnumOnEngineShutdown");
    if (this->DoHeapEnumOnEngineShutdown == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19c] == true) {
    Output::Print(L"-%s",L"RegexTracing");
    if (this->RegexTracing == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19d] == true) {
    Output::Print(L"-%s",L"RegexProfile");
    if (this->RegexProfile == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19e] == true) {
    Output::Print(L"-%s",L"RegexDebug");
    if (this->RegexDebug == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x19f] == true) {
    Output::Print(L"-%s",L"RegexDebugAST");
    if (this->RegexDebugAST == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a0] == true) {
    Output::Print(L"-%s",L"RegexDebugAnnotatedAST");
    if (this->RegexDebugAnnotatedAST == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a1] == true) {
    Output::Print(L"-%s",L"RegexBytecodeDebug");
    if (this->RegexBytecodeDebug == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a2] == true) {
    Output::Print(L"-%s",L"RegexOptimize");
    if (this->RegexOptimize == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a3] == true) {
    Output::Print(L"-%s",L"DynamicRegexMruListSize");
    Output::Print(L":%d",(ulong)(uint)this->DynamicRegexMruListSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a4] == true) {
    Output::Print(L"-%s",L"OptimizeForManyInstances");
    if (this->OptimizeForManyInstances == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a5] == true) {
    Output::Print(L"-%s",L"EnableArrayTypeMutation");
    if (this->EnableArrayTypeMutation == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a6] == true) {
    Output::Print(L"-%s",L"ArrayMutationTestSeed");
    Output::Print(L":%d",(ulong)(uint)this->ArrayMutationTestSeed);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a7] == true) {
    Output::Print(L"-%s",L"TestTrace");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a8] == true) {
    Output::Print(L"-%s",L"EnableEvalMapCleanup");
    if (this->EnableEvalMapCleanup == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1a9] == true) {
    Output::Print(L"-%s",L"TraceObjectAllocation");
    if (this->TraceObjectAllocation == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1aa] == true) {
    Output::Print(L"-%s",L"Sse");
    Output::Print(L":%d",(ulong)(uint)this->Sse);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ab] == true) {
    Output::Print(L"-%s",L"DeletedPropertyReuseThreshold");
    Output::Print(L":%d",(ulong)(uint)this->DeletedPropertyReuseThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ac] == true) {
    Output::Print(L"-%s",L"ForceStringKeyedSimpleDictionaryTypeHandler");
    if (this->ForceStringKeyedSimpleDictionaryTypeHandler == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ad] == true) {
    Output::Print(L"-%s",L"BigDictionaryTypeHandlerThreshold");
    Output::Print(L":%d",(ulong)(uint)this->BigDictionaryTypeHandlerThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ae] == true) {
    Output::Print(L"-%s",L"TypeSnapshotEnumeration");
    if (this->TypeSnapshotEnumeration == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1af] == true) {
    Output::Print(L"-%s",L"IsolatePrototypes");
    if (this->IsolatePrototypes == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b0] == true) {
    Output::Print(L"-%s",L"ChangeTypeOnProto");
    if (this->ChangeTypeOnProto == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b1] == true) {
    Output::Print(L"-%s",L"ShareInlineCaches");
    if (this->ShareInlineCaches == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b2] == true) {
    Output::Print(L"-%s",L"DisableDebugObject");
    if (this->DisableDebugObject == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b3] == true) {
    Output::Print(L"-%s",L"DumpHeap");
    if (this->DumpHeap == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b4] == true) {
    Output::Print(L"-%s",L"autoProxy");
    Output::Print(L":%s",(this->autoProxy).pszValue);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b5] == true) {
    Output::Print(L"-%s",L"PerfHintLevel");
    Output::Print(L":%d",(ulong)(uint)this->PerfHintLevel);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b6] == true) {
    Output::Print(L"-%s",L"MemProtectHeapStress");
    if (this->MemProtectHeapStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b7] == true) {
    Output::Print(L"-%s",L"MemProtectHeapBackgroundStress");
    if (this->MemProtectHeapBackgroundStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b8] == true) {
    Output::Print(L"-%s",L"MemProtectHeapConcurrentStress");
    if (this->MemProtectHeapConcurrentStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1b9] == true) {
    Output::Print(L"-%s",L"MemProtectHeapConcurrentRepeatStress");
    if (this->MemProtectHeapConcurrentRepeatStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ba] == true) {
    Output::Print(L"-%s",L"MemProtectHeapPartialStress");
    if (this->MemProtectHeapPartialStress == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1bb] == true) {
    Output::Print(L"-%s",L"FixPropsOnPathTypes");
    if (this->FixPropsOnPathTypes == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1bc] == true) {
    Output::Print(L"-%s",L"BailoutTraceFilter");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1bd] == true) {
    Output::Print(L"-%s",L"RejitTraceFilter");
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1be] == true) {
    Output::Print(L"-%s",L"MaxBackgroundFinishMarkCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxBackgroundFinishMarkCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1bf] == true) {
    Output::Print(L"-%s",L"BackgroundFinishMarkWaitTime");
    Output::Print(L":%d",(ulong)(uint)this->BackgroundFinishMarkWaitTime);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c0] == true) {
    Output::Print(L"-%s",L"MinBackgroundRepeatMarkRescanBytes");
    Output::Print(L":%d",(ulong)(uint)this->MinBackgroundRepeatMarkRescanBytes);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c1] == true) {
    Output::Print(L"-%s",L"ZeroMemoryWithNonTemporalStore");
    if (this->ZeroMemoryWithNonTemporalStore == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c2] == true) {
    Output::Print(L"-%s",L"MaxMarkStackPageCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxMarkStackPageCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c3] == true) {
    Output::Print(L"-%s",L"MaxTrackedObjectListCount");
    Output::Print(L":%d",(ulong)(uint)this->MaxTrackedObjectListCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c4] == true) {
    Output::Print(L"-%s",L"NumberAllocPlusSize");
    Output::Print(L":%d",(ulong)(uint)this->NumberAllocPlusSize);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c5] == true) {
    Output::Print(L"-%s",L"InitializeInterpreterSlotsWithInvalidStackVar");
    if (this->InitializeInterpreterSlotsWithInvalidStackVar == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c6] == true) {
    Output::Print(L"-%s",L"PRNGSeed0");
    Output::Print(L":%d",(ulong)(uint)this->PRNGSeed0);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c7] == true) {
    Output::Print(L"-%s",L"PRNGSeed1");
    Output::Print(L":%d",(ulong)(uint)this->PRNGSeed1);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c8] == true) {
    Output::Print(L"-%s",L"ClearInlineCachesOnCollect");
    if (this->ClearInlineCachesOnCollect == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1c9] == true) {
    Output::Print(L"-%s",L"InlineCacheInvalidationListCompactionThreshold");
    Output::Print(L":%d",(ulong)(uint)this->InlineCacheInvalidationListCompactionThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ca] == true) {
    Output::Print(L"-%s",L"ConstructorCacheInvalidationThreshold");
    Output::Print(L":%d",(ulong)(uint)this->ConstructorCacheInvalidationThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1cb] == true) {
    Output::Print(L"-%s",L"GCMemoryThreshold");
    Output::Print(L":%d",(ulong)(uint)this->GCMemoryThreshold);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1cc] == true) {
    Output::Print(L"-%s",L"SimulatePolyCacheWithOneTypeForInlineCacheIndex");
    Output::Print(L":%d",(ulong)(uint)this->SimulatePolyCacheWithOneTypeForInlineCacheIndex);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1cd] == true) {
    Output::Print(L"-%s",L"JITServerIdleTimeout");
    Output::Print(L":%d",(ulong)(uint)this->JITServerIdleTimeout);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1ce] == true) {
    Output::Print(L"-%s",L"JITServerMaxInactivePageAllocatorCount");
    Output::Print(L":%d",(ulong)(uint)this->JITServerMaxInactivePageAllocatorCount);
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1cf] == true) {
    Output::Print(L"-%s",L"StrictWriteBarrierCheck");
    if (this->StrictWriteBarrierCheck == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d0] == true) {
    Output::Print(L"-%s",L"WriteBarrierTest");
    if (this->WriteBarrierTest == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d1] == true) {
    Output::Print(L"-%s",L"ForceSoftwareWriteBarrier");
    if (this->ForceSoftwareWriteBarrier == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d2] == true) {
    Output::Print(L"-%s",L"VerifyBarrierBit");
    if (this->VerifyBarrierBit == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d3] == true) {
    Output::Print(L"-%s",L"EnableBGFreeZero");
    if (this->EnableBGFreeZero == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d4] == true) {
    Output::Print(L"-%s",L"KeepRecyclerTrackData");
    if (this->KeepRecyclerTrackData == false) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  if (this->flagPresent[0x1d5] == true) {
    Output::Print(L"-%s",L"MaxSingleAllocSizeInMB");
    Output::Print(L":%d",(ulong)(uint)this->MaxSingleAllocSizeInMB);
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void
    ConfigFlagsTable::VerboseDump()
    {
#define FLAG(type, name, ...) \
        if (IsEnabled(name##Flag)) \
        { \
            Output::Print(_u("-%s"), _u(#name)); \
            switch (Flag##type) \
            { \
            case FlagBoolean: \
                if (!*GetAsBoolean(name##Flag)) \
                { \
                    Output::Print(_u("-")); \
                } \
                break; \
            case FlagString: \
                if (GetAsString(name##Flag) != nullptr) \
                { \
                    Output::Print(_u(":%s"), (LPCWSTR)*GetAsString(name##Flag)); \
                } \
                break; \
            case FlagNumber: \
                Output::Print(_u(":%d"), *GetAsNumber(name##Flag)); \
                break; \
            default: \
                break; \
            }; \
            Output::Print(_u("\n")); \
        }

#include "ConfigFlagsList.h"
#undef FLAG
    }